

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.c
# Opt level: O3

int flatcc_builder_start_string(flatcc_builder_t *B)

{
  __flatcc_builder_frame_t *p_Var1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = enter_frame(B,1);
  iVar3 = -1;
  if (iVar2 == 0) {
    (B->frame->container).table.vs_end = 1;
    (B->frame->container).table.pl_end = 0;
    p_Var1 = B->frame;
    p_Var1->type = 6;
    uVar4 = (int)B->buffers[1].iov_len - B->ds_first;
    uVar5 = 0xfffffffc;
    if (uVar4 < 0xfffffffc) {
      uVar5 = uVar4;
    }
    B->ds = (uint8_t *)((ulong)B->ds_first + (long)B->buffers[1].iov_base);
    B->ds_limit = uVar5;
    p_Var1->type_limit = 0xfffffffc;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

int flatcc_builder_start_string(flatcc_builder_t *B)
{
    if (enter_frame(B, 1)) {
        return -1;
    }
    frame(container.vector.elem_size) = 1;
    frame(container.vector.count) = 0;
    frame(type) = flatcc_builder_string;
    refresh_ds(B, data_limit);
    return 0;
}